

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIBuildOnlyReporterUtils.cpp
# Opt level: O0

FrontLoadedReporterDisposer
ApprovalTests::CIBuildOnlyReporterUtils::useAsFrontLoadedReporter
          (shared_ptr<ApprovalTests::Reporter> *reporter)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ApprovalTests::Reporter> *in_RDI;
  FrontLoadedReporterDisposer FVar1;
  shared_ptr<ApprovalTests::CIBuildOnlyReporter> *in_stack_ffffffffffffff98;
  shared_ptr<ApprovalTests::Reporter> *in_stack_ffffffffffffffc8;
  
  ::std::
  make_shared<ApprovalTests::CIBuildOnlyReporter,std::shared_ptr<ApprovalTests::Reporter>const&>
            (in_stack_ffffffffffffffc8);
  ::std::shared_ptr<ApprovalTests::Reporter>::shared_ptr<ApprovalTests::CIBuildOnlyReporter,void>
            (in_RDI,in_stack_ffffffffffffff98);
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
  useAsFrontLoadedReporter((shared_ptr<ApprovalTests::Reporter> *)in_stack_ffffffffffffff98);
  ::std::shared_ptr<ApprovalTests::Reporter>::~shared_ptr
            ((shared_ptr<ApprovalTests::Reporter> *)0x20c63e);
  ::std::shared_ptr<ApprovalTests::CIBuildOnlyReporter>::~shared_ptr
            ((shared_ptr<ApprovalTests::CIBuildOnlyReporter> *)0x20c648);
  FVar1.previous_result.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  FVar1.previous_result.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)in_RDI;
  return (FrontLoadedReporterDisposer)
         FVar1.previous_result.
         super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FrontLoadedReporterDisposer CIBuildOnlyReporterUtils::useAsFrontLoadedReporter(
        const std::shared_ptr<Reporter>& reporter)
    {
        return Approvals::useAsFrontLoadedReporter(
            std::make_shared<ApprovalTests::CIBuildOnlyReporter>(reporter));
    }